

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O2

wchar_t mass_roll(wchar_t times,wchar_t max)

{
  uint32_t uVar1;
  wchar_t wVar2;
  bool bVar3;
  
  wVar2 = L'\0';
  if (times < L'\x01') {
    times = L'\0';
    wVar2 = L'\0';
  }
  while (bVar3 = times != L'\0', times = times + L'\xffffffff', bVar3) {
    uVar1 = Rand_div(max);
    wVar2 = wVar2 + uVar1;
  }
  return wVar2;
}

Assistant:

static int mass_roll(int times, int max)
{
	int i, t = 0;

	assert(max > 1);

	for (i = 0; i < times; i++)
		t += randint0(max);

	return (t);
}